

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O1

void __thiscall
diy::RegularLink<diy::Bounds<double>_>::save
          (RegularLink<diy::Bounds<double>_> *this,BinaryBuffer *bb)

{
  Serialization<std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>::save
            (bb,&(this->super_Registrar<diy::RegularLink<diy::Bounds<double>_>_>).super_Link.
                 neighbors_);
  (*bb->_vptr_BinaryBuffer[2])(bb,&this->dim_,4);
  Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
  ::save(bb,&this->dir_map_);
  Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::save
            (bb,&this->dir_vec_);
  Serialization<diy::DynamicPoint<double,_4UL>_>::save(bb,&(this->core_).min);
  Serialization<diy::DynamicPoint<double,_4UL>_>::save(bb,&(this->core_).max);
  Serialization<diy::DynamicPoint<double,_4UL>_>::save(bb,&(this->bounds_).min);
  Serialization<diy::DynamicPoint<double,_4UL>_>::save(bb,&(this->bounds_).max);
  Serialization<std::vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>_>::save
            (bb,&this->nbr_cores_);
  Serialization<std::vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>_>::save
            (bb,&this->nbr_bounds_);
  Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::save
            (bb,&this->wrap_);
  return;
}

Assistant:

void      save(BinaryBuffer& bb) const override
      {
          Link::save(bb);
          diy::save(bb, dim_);
          diy::save(bb, dir_map_);
          diy::save(bb, dir_vec_);
          diy::save(bb, core_);
          diy::save(bb, bounds_);
          diy::save(bb, nbr_cores_);
          diy::save(bb, nbr_bounds_);
          diy::save(bb, wrap_);
      }